

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_internal.h
# Opt level: O1

h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> * __thiscall
AS_02::h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
          (h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *this)

{
  _List_node_base *p_Var1;
  ui32_t uVar2;
  _List_node_base *p_Var3;
  long in_RSI;
  int64_t tmp_pos;
  undefined8 local_90;
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  uVar2 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(in_RSI + 0x448));
  if (uVar2 != 0) {
    (**(code **)(*(long *)(in_RSI + 0x10) + 0x30))(&stack0xffffffffffffff78,in_RSI + 0x10,&local_90)
    ;
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff78);
    *(undefined8 *)(in_RSI + 0x4d0) = local_90;
    MXF::AS02IndexWriterVBR::WriteToFile
              ((AS02IndexWriterVBR *)&stack0xffffffffffffff78,(FileWriter *)(in_RSI + 0x448));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff78);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff78);
    p_Var1 = *(_List_node_base **)(in_RSI + 0x4d0);
    p_Var3 = (_List_node_base *)operator_new(0x28);
    p_Var3[1]._M_next = (_List_node_base *)&PTR__IArchive_0016ce10;
    *(undefined4 *)&p_Var3[1]._M_prev = 0;
    p_Var3[2]._M_next = p_Var1;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    *(long *)(in_RSI + 0x2f8) = *(long *)(in_RSI + 0x2f8) + 1;
  }
  return this;
}

Assistant:

Result_t FlushIndexPartition()
      {
          Result_t result = RESULT_OK;
	    if ( this->m_IndexWriter.GetDuration() > 0 )
	    {
	    this->m_IndexWriter.ThisPartition = this->m_File.TellPosition();
	    result = this->m_IndexWriter.WriteToFile(this->m_File);
	    this->m_RIP.PairArray.push_back(RIP::PartitionPair(0, this->m_IndexWriter.ThisPartition));
	    }
          return result;
      }